

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O2

from_chars_result __thiscall
semver::detail::range_parser::parse_range_comparator<int,int,int>
          (range_parser *this,
          vector<semver::detail::range_comparator<int,_int,_int>,_std::allocator<semver::detail::range_comparator<int,_int,_int>_>_>
          *out)

{
  bool bVar1;
  variant_alternative_t<3UL,_variant<monostate,_unsigned_char,_char,_range_operator>_> *pvVar2;
  char *pcVar3;
  from_chars_result fVar4;
  range_operator op;
  version_parser parser;
  token token;
  version<int,_int,_int> ver;
  
  op = equal;
  token.value.
  super__Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Move_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Copy_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Move_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Copy_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Variant_storage_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  _M_index = '\0';
  bVar1 = token_stream::advanceIfMatch(&this->stream,&token,range_operator);
  if (bVar1) {
    pvVar2 = std::get<3UL,_std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                       (&token.value);
    op = *pvVar2;
  }
  skip_whitespaces(this);
  ver.prerelease_tag_._M_dataplus._M_p = (pointer)&ver.prerelease_tag_.field_2;
  ver.major_ = 0;
  ver.minor_ = 1;
  ver.patch_ = 0;
  ver.prerelease_tag_._M_string_length = 0;
  ver.prerelease_tag_.field_2._M_local_buf[0] = '\0';
  ver.build_metadata_._M_dataplus._M_p = (pointer)&ver.build_metadata_.field_2;
  ver.build_metadata_._M_string_length = 0;
  ver.build_metadata_.field_2._M_local_buf[0] = '\0';
  ver.prerelease_identifiers.
  super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ver.prerelease_identifiers.
  super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ver.prerelease_identifiers.
  super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  parser.stream = &this->stream;
  fVar4 = version_parser::parse<int,int,int>(&parser,&ver);
  pcVar3 = fVar4.super_from_chars_result.ptr;
  if (fVar4.super_from_chars_result.ec == 0) {
    std::
    vector<semver::detail::range_comparator<int,int,int>,std::allocator<semver::detail::range_comparator<int,int,int>>>
    ::emplace_back<semver::version<int,int,int>&,semver::detail::range_operator&>
              ((vector<semver::detail::range_comparator<int,int,int>,std::allocator<semver::detail::range_comparator<int,int,int>>>
                *)out,&ver,&op);
    pcVar3 = (this->stream).tokens.
             super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
             _M_impl.super__Vector_impl_data._M_start[(this->stream).current].lexeme;
  }
  version<int,_int,_int>::~version(&ver);
  fVar4.super_from_chars_result.ptr = pcVar3;
  fVar4.super_from_chars_result._12_4_ = 0;
  return (from_chars_result)fVar4.super_from_chars_result;
}

Assistant:

SEMVER_CONSTEXPR from_chars_result parse_range_comparator(std::vector<detail::range_comparator<I1, I2, I3>>& out) noexcept {
      range_operator op = range_operator::equal;
      token token;
      if (stream.advanceIfMatch(token, token_type::range_operator)) {
        op = std::get<range_operator>(token.value);
      }

      skip_whitespaces();

      version<I1, I2, I3> ver;
      version_parser parser{ stream };
      if (const auto res = parser.parse(ver); !res) {
        return res;
      }

      out.emplace_back(ver, op);
      return success(stream.peek().lexeme);
    }